

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

size_type __thiscall Catch::StringRef::numberOfCharacters(StringRef *this)

{
  size_type sVar1;
  size_type sVar2;
  byte bVar3;
  size_type sVar4;
  
  sVar1 = this->m_size;
  if (sVar1 != 0) {
    sVar2 = 0;
    sVar4 = sVar1;
    do {
      bVar3 = ~this->m_start[sVar2];
      if ((bVar3 & 0xc0) == 0) {
        sVar4 = ((-1 - (ulong)((bVar3 & 0xe0) == 0)) + sVar4) - (ulong)((bVar3 & 0xf0) == 0);
      }
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
    return sVar4;
  }
  return 0;
}

Assistant:

auto StringRef::numberOfCharacters() const noexcept -> size_type {
        size_type noChars = m_size;
        // Make adjustments for uft encodings
        for( size_type i=0; i < m_size; ++i ) {
            char c = m_start[i];
            if( ( c & byte_2_lead ) == byte_2_lead ) {
                noChars--;
                if (( c & byte_3_lead ) == byte_3_lead )
                    noChars--;
                if( ( c & byte_4_lead ) == byte_4_lead )
                    noChars--;
            }
        }
        return noChars;
    }